

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

uchar * glfwGetJoystickButtons(int joy,int *count)

{
  int *count_local;
  uchar *puStack_10;
  int joy_local;
  
  *count = 0;
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    puStack_10 = (uchar *)0x0;
  }
  else if ((joy < 0) || (0xf < joy)) {
    _glfwInputError(0x10003,(char *)0x0);
    puStack_10 = (uchar *)0x0;
  }
  else {
    puStack_10 = _glfwPlatformGetJoystickButtons(joy,count);
  }
  return puStack_10;
}

Assistant:

char* glfwGetJoystickButtons(int joy, int* count)
{
    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (joy < 0 || joy > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, NULL);
        return NULL;
    }

    return _glfwPlatformGetJoystickButtons(joy, count);
}